

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::findPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint proxyId1_00;
  int *piVar5;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btHashedOverlappingPairCache *in_RDI;
  int index;
  int hash;
  int proxyId2;
  int proxyId1;
  btBroadphaseProxy *local_20;
  btBroadphaseProxy *local_18 [2];
  btBroadphasePair *local_8;
  
  gFindPairs = gFindPairs + 1;
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  if (in_RDX->m_uniqueId < in_RSI->m_uniqueId) {
    btSwap<btBroadphaseProxy*>(local_18,&local_20);
  }
  uVar2 = btBroadphaseProxy::getUid(local_18[0]);
  uVar3 = btBroadphaseProxy::getUid(local_20);
  uVar3 = getHash(in_RDI,uVar2,uVar3);
  iVar4 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
  proxyId1_00 = uVar3 & iVar4 - 1U;
  uVar2 = proxyId1_00;
  iVar4 = btAlignedObjectArray<int>::size(&in_RDI->m_hashTable);
  if ((int)proxyId1_00 < iVar4) {
    piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
    iVar4 = *piVar5;
    while( true ) {
      bVar1 = false;
      if (iVar4 != -1) {
        btAlignedObjectArray<btBroadphasePair>::operator[](&in_RDI->m_overlappingPairArray,iVar4);
        bVar1 = equalsPair((btHashedOverlappingPairCache *)CONCAT44(uVar2,iVar4),
                           (btBroadphasePair *)in_RDI,proxyId1_00,uVar3);
        bVar1 = !bVar1;
      }
      if (!bVar1) break;
      piVar5 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar4);
      iVar4 = *piVar5;
    }
    if (iVar4 == -1) {
      local_8 = (btBroadphasePair *)0x0;
    }
    else {
      local_8 = btAlignedObjectArray<btBroadphasePair>::operator[]
                          (&in_RDI->m_overlappingPairArray,iVar4);
    }
  }
  else {
    local_8 = (btBroadphasePair *)0x0;
  }
  return local_8;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	gFindPairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_NULL_PAIR && equalsPair(m_overlappingPairArray[index], proxyId1, proxyId2) == false)
	{
		index = m_next[index];
	}

	if (index == BT_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}